

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AudioFeaturePrint.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::CoreMLModels::AudioFeaturePrint::ByteSizeLong(AudioFeaturePrint *this)

{
  size_t sVar1;
  
  if (this->_oneof_case_[0] == 0x14) {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::CoreMLModels::AudioFeaturePrint_Sound>
                      ((this->AudioFeaturePrintType_).sound_);
    sVar1 = sVar1 + 2;
  }
  else {
    sVar1 = 0;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t AudioFeaturePrint::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.AudioFeaturePrint)
  size_t total_size = 0;

  switch (AudioFeaturePrintType_case()) {
    // .CoreML.Specification.CoreMLModels.AudioFeaturePrint.Sound sound = 20;
    case kSound: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *AudioFeaturePrintType_.sound_);
      break;
    }
    case AUDIOFEATUREPRINTTYPE_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}